

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_extra_field_api.c
# Opt level: O3

zip_int16_t zip_file_extra_fields_count(zip_t *za,zip_uint64_t idx,zip_flags_t flags)

{
  int iVar1;
  zip_dirent_t *pzVar2;
  zip_extra_field_t *pzVar3;
  zip_int16_t zVar4;
  
  if ((flags & 0x300) == 0) {
    zip_error_set(&za->error,0x12,0);
    zVar4 = -1;
  }
  else {
    pzVar2 = _zip_get_dirent(za,idx,flags,&za->error);
    zVar4 = -1;
    if (pzVar2 != (zip_dirent_t *)0x0) {
      if (((flags >> 8 & 1) != 0) && (iVar1 = _zip_read_local_ef(za,idx), iVar1 < 0)) {
        return -1;
      }
      zVar4 = 0;
      for (pzVar3 = pzVar2->extra_fields; pzVar3 != (zip_extra_field_t *)0x0; pzVar3 = pzVar3->next)
      {
        zVar4 = (zVar4 + 1) - (ushort)((pzVar3->flags & flags & 0x300) == 0);
      }
    }
  }
  return zVar4;
}

Assistant:

ZIP_EXTERN zip_int16_t
zip_file_extra_fields_count(zip_t *za, zip_uint64_t idx, zip_flags_t flags) {
    zip_dirent_t *de;
    zip_extra_field_t *ef;
    zip_uint16_t n;

    if ((flags & ZIP_EF_BOTH) == 0) {
	zip_error_set(&za->error, ZIP_ER_INVAL, 0);
	return -1;
    }

    if ((de = _zip_get_dirent(za, idx, flags, &za->error)) == NULL)
	return -1;

    if (flags & ZIP_FL_LOCAL)
	if (_zip_read_local_ef(za, idx) < 0)
	    return -1;

    n = 0;
    for (ef = de->extra_fields; ef; ef = ef->next)
	if (ef->flags & flags & ZIP_EF_BOTH)
	    n++;

    return (zip_int16_t)n;
}